

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_approximate_table_::run
          (Test_intlog_log10floor_approximate_table_ *this)

{
  string_view msg;
  SourceLocation loc;
  char *pcVar1;
  long *plVar2;
  size_type *psVar3;
  Table<unsigned_char,_64UL> table;
  size_t in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Table<unsigned_char,_64UL> local_58;
  
  builtin_memcpy(local_58.data + 0x30,
                 "\x0e\x0e\x0f\x0f\x0f\x0f\x10\x10\x10\x11\x11\x11\x12\x12\x12\x12",0x10);
  builtin_memcpy(local_58.data + 0x20,"\t\t\n\n\n\v\v\v\f\f\f\f\r\r\r\x0e",0x10);
  builtin_memcpy(local_58.data + 0x10,"\x04\x05\x05\x05\x06\x06\x06\x06\a\a\a\b\b\b\t\t",0x10);
  local_58.data[0] = '\0';
  local_58.data[1] = '\0';
  local_58.data[2] = '\0';
  local_58.data[3] = '\0';
  local_58.data[4] = '\x01';
  local_58.data[5] = '\x01';
  local_58.data[6] = '\x01';
  local_58.data[7] = '\x02';
  local_58.data[8] = '\x02';
  local_58.data[9] = '\x02';
  local_58.data[10] = '\x03';
  local_58.data[0xb] = '\x03';
  local_58.data[0xc] = '\x03';
  local_58.data[0xd] = '\x03';
  local_58.data[0xe] = '\x04';
  local_58.data[0xf] = '\x04';
  pcVar1 = (char *)detail::approximateGuessTable<64ul>(&local_58);
  if (pcVar1 != (char *)0xffffffffffffffff) {
    return;
  }
  detail::stringify_impl<unsigned_long>(&local_b8,(unsigned_long *)&stack0xfffffffffffffec8);
  std::operator+(&local_98,
                 "Comparison failed: detail::approximateGuessTable(table) != detail::NO_APPROXIMATION (with \"detail::approximateGuessTable(table)\"="
                 ,&local_b8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_130._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar3) {
    local_130.field_2._M_allocated_capacity = *psVar3;
    local_130.field_2._8_8_ = plVar2[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar3;
  }
  local_130._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  detail::stringify_impl<unsigned_long>(&local_d8,&detail::NO_APPROXIMATION);
  std::operator+(&local_78,&local_130,&local_d8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  *plVar2 = (long)(plVar2 + 2);
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  msg._M_str = pcVar1;
  msg._M_len = in_stack_fffffffffffffec0;
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  loc.line = 0x2f;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(intlog, log10floor_approximate_table)
{
    auto table = detail::makeGuessTable<std::uint64_t, 10>();
    BITMANIP_ASSERT_NE(detail::approximateGuessTable(table), detail::NO_APPROXIMATION);
}